

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteHighLevelDirectives
          (cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root,ostream *fout)

{
  cmake *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  size_t sVar5;
  char *local_218;
  char *local_210;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  string local_158;
  allocator<char> local_131;
  string local_130;
  char *local_110;
  char *customization;
  string local_100;
  char *local_e0;
  char *p;
  string local_d0;
  char *local_b0;
  char *a;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  char *local_48;
  char *t;
  string tgt;
  ostream *fout_local;
  cmLocalGenerator *root_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  tgt.field_2._8_8_ = fout;
  std::__cxx11::string::string((string *)&t);
  pcVar1 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"GHS_PRIMARY_TARGET",&local_79);
  pcVar2 = cmake::GetCacheDefinition(pcVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  local_48 = pcVar2;
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    pcVar1 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)((long)&p + 7));
    pcVar2 = cmake::GetCacheDefinition(pcVar1,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&p + 7));
    local_b0 = pcVar2;
    pcVar1 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"GHS_TARGET_PLATFORM",
               (allocator<char> *)((long)&customization + 7));
    pcVar2 = cmake::GetCacheDefinition(pcVar1,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)((long)&customization + 7));
    if (local_b0 == (char *)0x0) {
      local_210 = "";
    }
    else {
      local_210 = local_b0;
    }
    local_e0 = pcVar2;
    std::__cxx11::string::operator=((string *)&t,local_210);
    std::__cxx11::string::operator+=((string *)&t,"_");
    if (local_e0 == (char *)0x0) {
      local_218 = "";
    }
    else {
      local_218 = local_e0;
    }
    std::__cxx11::string::operator+=((string *)&t,local_218);
    std::__cxx11::string::operator+=((string *)&t,".tgt");
  }
  else {
    std::__cxx11::string::operator=((string *)&t,pcVar2);
    pcVar1 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"GHS_PRIMARY_TARGET",(allocator<char> *)((long)&a + 7));
    cmake::MarkCliAsUsed(pcVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&a + 7));
  }
  poVar3 = std::operator<<((ostream *)tgt.field_2._8_8_,"primaryTarget=");
  poVar3 = std::operator<<(poVar3,(string *)&t);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)tgt.field_2._8_8_,"customization=");
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(root);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  poVar3 = std::operator<<(poVar3,"/CMakeFiles/custom_rule.bod");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)tgt.field_2._8_8_,"customization=");
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(root);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  poVar3 = std::operator<<(poVar3,"/CMakeFiles/custom_target.bod");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"GHS_CUSTOMIZATION",&local_131);
  pcVar2 = cmake::GetCacheDefinition(pcVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  local_110 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    sVar5 = strlen(pcVar2);
    if (sVar5 != 0) {
      poVar3 = std::operator<<((ostream *)tgt.field_2._8_8_,"customization=");
      pcVar2 = local_110;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,pcVar2,&local_179);
      TrimQuotes(&local_158,this,&local_178);
      poVar3 = std::operator<<(poVar3,(string *)&local_158);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
      pcVar1 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"GHS_CUSTOMIZATION",&local_1a1);
      cmake::MarkCliAsUsed(pcVar1,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
    }
  }
  std::__cxx11::string::~string((string *)&t);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteHighLevelDirectives(
  cmLocalGenerator* root, std::ostream& fout)
{
  /* set primary target */
  std::string tgt;
  const char* t =
    this->GetCMakeInstance()->GetCacheDefinition("GHS_PRIMARY_TARGET");
  if (t && *t != '\0') {
    tgt = t;
    this->GetCMakeInstance()->MarkCliAsUsed("GHS_PRIMARY_TARGET");
  } else {
    const char* a =
      this->GetCMakeInstance()->GetCacheDefinition("CMAKE_GENERATOR_PLATFORM");
    const char* p =
      this->GetCMakeInstance()->GetCacheDefinition("GHS_TARGET_PLATFORM");
    tgt = (a ? a : "");
    tgt += "_";
    tgt += (p ? p : "");
    tgt += ".tgt";
  }

  fout << "primaryTarget=" << tgt << std::endl;
  fout << "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_rule.bod" << std::endl;
  fout << "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_target.bod" << std::endl;

  char const* const customization =
    this->GetCMakeInstance()->GetCacheDefinition("GHS_CUSTOMIZATION");
  if (nullptr != customization && strlen(customization) > 0) {
    fout << "customization=" << this->TrimQuotes(customization) << std::endl;
    this->GetCMakeInstance()->MarkCliAsUsed("GHS_CUSTOMIZATION");
  }
}